

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EngineSearch.h
# Opt level: O2

string * __thiscall
EngineSearch::operator()[abi_cxx11_(string *__return_storage_ptr__,EngineSearch *this,Token *token)

{
  Client *pCVar1;
  char *pcVar2;
  size_t sVar3;
  pointer pcVar4;
  size_type sVar5;
  undefined1 auVar6 [8];
  bool bVar7;
  Error error;
  Error error_00;
  char *in_R9;
  string_view replacement;
  string_view find;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view source;
  string_view subtoken;
  undefined1 local_200 [8];
  string tokenName;
  string url;
  undefined1 local_1a0 [8];
  Result result;
  string local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string redirectUrl;
  Result local_a0;
  undefined1 local_60 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> link;
  allocator<char> local_31;
  
  if (token->type == std) {
    std::__cxx11::string::string((string *)local_200,(string *)token);
    replacement._M_str = in_R9;
    replacement._M_len = (size_t)"%3A%3A";
    find._M_str = (char *)0x6;
    find._M_len = (size_t)"::";
    ::str::replace_all((str *)local_200,(string *)0x2,find,replacement);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&tokenName.field_2 + 8),"/mwiki/index.php?title=Special%3ASearch&search=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200);
    pCVar1 = (this->super_SearchBase).tokenClient;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,(char *)tokenName.field_2._8_8_,(allocator<char> *)local_e0);
    httplib::Client::Get((Result *)local_1a0,pCVar1,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    auVar6 = local_1a0;
    httplib::to_string_abi_cxx11_
              ((string *)&local_a0,
               (httplib *)
               (ulong)(uint)result.res_._M_t.
                            super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                            .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,error);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count,
               "File: ",(allocator<char> *)(url.field_2._M_local_buf + 8));
    std::operator+(&local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &result.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/linker/EngineSearch.h"
                  );
    std::operator+(&local_100,&local_120,", Func: ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&redirectUrl.field_2 + 8),&local_100,"operator()");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&redirectUrl.field_2 + 8),", Line: ");
    std::__cxx11::to_string(&local_140,0x1d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140);
    check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
              ((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)auVar6
               != (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0,
               (char (*) [14])"Error state: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
               (char (*) [2])0x1b9727,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)(redirectUrl.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string
              ((string *)&result.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)&local_a0);
    check<std::__cxx11::string&>
              (*(int *)((long)local_1a0 + 0x20) == 0x12e || *(int *)((long)local_1a0 + 0x20) == 200,
               (string *)((long)local_1a0 + 0x28));
    auVar6 = local_1a0;
    if (*(int *)((long)local_1a0 + 0x20) == 0x12e) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Location",(allocator<char> *)local_60);
      httplib::Response::get_header_value
                ((string *)local_e0,(Response *)auVar6,(string *)&local_a0,0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::find((char *)local_e0,0x1c60fd);
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)local_e0);
      std::__cxx11::string::operator=((string *)local_e0,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      pCVar1 = (this->super_SearchBase).tokenClient;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_60,(char *)local_e0,
                 (allocator<char> *)(redirectUrl.field_2._M_local_buf + 8));
      httplib::Client::Get(&local_a0,pCVar1,(string *)local_60);
      httplib::Result::operator=((Result *)local_1a0,&local_a0);
      httplib::Result::~Result(&local_a0);
      std::__cxx11::string::~string((string *)local_60);
      auVar6 = local_1a0;
      httplib::to_string_abi_cxx11_
                ((string *)&local_a0,
                 (httplib *)
                 (ulong)(uint)result.res_._M_t.
                              super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                              .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl,
                 error_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"File: ",&local_31);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_140
                     ,
                     "/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/src/linker/EngineSearch.h"
                    );
      std::operator+(&local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &result.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     ", Func: ");
      std::operator+(&local_100,&local_120,"operator()");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&redirectUrl.field_2 + 8),&local_100,", Line: ");
      std::__cxx11::to_string((string *)((long)&url.field_2 + 8),0x25);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&redirectUrl.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&url.field_2 + 8));
      check<char_const(&)[14],std::__cxx11::string,char_const(&)[2],std::__cxx11::string>
                ((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)auVar6
                 != (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0
                 ,(char (*) [14])"Error state: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                 (char (*) [2])0x1b9727,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)(url.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(redirectUrl.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string
                ((string *)&result.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count
                );
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_a0);
      check<std::__cxx11::string&>
                (*(int *)((long)local_1a0 + 0x20) == 200,(string *)((long)local_1a0 + 0x28));
      pcVar2 = (((string *)((long)local_1a0 + 0x78))->_M_dataplus)._M_p;
      sVar3 = *(size_type *)((long)local_1a0 + 0x80);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"<title>",(allocator<char> *)&local_100);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_60,"</title>",(allocator<char> *)&local_120);
      source._M_str = pcVar2;
      source._M_len = sVar3;
      snip_between((pair<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long> *)
                   ((long)&redirectUrl.field_2 + 8),source,(string *)&local_a0,(string *)local_60,0)
      ;
      std::__cxx11::string::~string((string *)local_60);
      std::__cxx11::string::~string((string *)&local_a0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)token,
                     " - cppreference.com");
      __y._M_str = (char *)local_a0.res_._M_t.
                           super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                           .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
      __y._M_len = local_a0._8_8_;
      bVar7 = std::operator!=(stack0xffffffffffffff40,__y);
      std::__cxx11::string::~string((string *)&local_a0);
      if (bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_a0);
      }
      else {
        std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(string *)(tokenName.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_e0);
    }
    else {
      pcVar4 = (token->content)._M_dataplus._M_p;
      sVar5 = (token->content)._M_string_length;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,">",(allocator<char> *)(redirectUrl.field_2._M_local_buf + 8));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_e0,"<",(allocator<char> *)&local_100);
      subtoken._M_str = pcVar4;
      subtoken._M_len = sVar5;
      SearchBase::findLinkToSubtoken
                ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_60,
                 &this->super_SearchBase,(string *)((long)local_1a0 + 0x78),subtoken,
                 (string *)&local_a0,(string *)local_e0);
      std::__cxx11::string::~string((string *)local_e0);
      std::__cxx11::string::~string((string *)&local_a0);
      if (link.
          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
          _M_payload.
          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
          _M_payload._8_1_ == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_a0);
      }
      else {
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)__return_storage_ptr__,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_60,
                   (allocator<char> *)&local_a0);
      }
    }
    httplib::Result::~Result((Result *)local_1a0);
    std::__cxx11::string::~string((string *)(tokenName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_200);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)local_1a0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const Token& token) {
			if (token.type != Token::Type::std) {
				return "";
			}

			std::string tokenName = token.content;
			str::replace_all(tokenName, "::", "%3A%3A");

			const std::string url = "/mwiki/index.php?title=Special%3ASearch&search=" + tokenName;
			httplib::Result result = tokenClient.Get(url.c_str());
			check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
			check((result->status == 200) or (result->status == 302), result->reason);

			if (result->status == 302) { // direct hit!
				std::string redirectUrl = result->get_header_value("Location");
				redirectUrl = redirectUrl.substr(redirectUrl.find("/w"));

				result = tokenClient.Get(redirectUrl.c_str());
				check(result, "Error state: ", httplib::to_string(result.error()), "\n", STD_HERE);
				check(result->status == 200, result->reason);

				const std::string_view title = snip_between(result->body, "<title>", "</title>").first;
				if (title != (token.content + " - cppreference.com")) {
					return "";
				}

				return url;
			}

			const std::optional<std::string_view> link = findLinkToSubtoken(result->body, token.content, ">", "<");
			if (!link.has_value()) {
				return "";
			}

			return std::string(link.value());
		}